

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool NavScoreItem(ImGuiNavMoveResult *result,ImRect cand)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  ImRect *pIVar7;
  ImRect *pIVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  ImRect cand_local;
  
  pIVar3 = GImGui;
  cand_local = cand;
  pIVar2 = GImGui->CurrentWindow;
  if (GImGui->NavLayer != (pIVar2->DC).NavLayerCurrent) {
    return false;
  }
  GImGui->NavScoringCount = GImGui->NavScoringCount + 1;
  if (pIVar2->ParentWindow == pIVar3->NavWindow) {
    bVar4 = ImRect::Contains(&pIVar2->ClipRect,&cand_local);
    if (!bVar4) {
      return false;
    }
    ImRect::ClipWithFull(&cand_local,&pIVar2->ClipRect);
  }
  if ((uint)pIVar3->NavMoveClipDir < 2) {
    pIVar7 = (ImRect *)&cand_local.Min.y;
    lVar6 = 0xc;
    pIVar8 = (ImRect *)&(pIVar2->ClipRect).Min.y;
  }
  else {
    pIVar7 = &cand_local;
    lVar6 = 8;
    pIVar8 = &pIVar2->ClipRect;
  }
  fVar10 = (pIVar7->Min).x;
  fVar9 = (pIVar8->Min).x;
  fVar11 = *(float *)((long)&(pIVar2->ClipRect).Min.x + lVar6);
  fVar14 = fVar11;
  if (fVar10 <= fVar11) {
    fVar14 = fVar10;
  }
  (pIVar7->Min).x =
       (float)(-(uint)(fVar10 < fVar9) & (uint)fVar9 | ~-(uint)(fVar10 < fVar9) & (uint)fVar14);
  fVar10 = *(float *)((long)&cand_local.Min.x + lVar6);
  if (fVar10 <= fVar11) {
    fVar11 = fVar10;
  }
  *(uint *)((long)&cand_local.Min.x + lVar6) =
       -(uint)(fVar10 < fVar9) & (uint)fVar9 | ~-(uint)(fVar10 < fVar9) & (uint)fVar11;
  fVar10 = (pIVar3->NavScoringRectScreen).Min.x;
  fVar9 = (pIVar3->NavScoringRectScreen).Max.x;
  if (fVar10 <= cand_local.Max.x) {
    fVar11 = 0.0;
    if (fVar9 < cand_local.Min.x) {
      fVar11 = cand_local.Min.x - fVar9;
    }
  }
  else {
    fVar11 = cand_local.Max.x - fVar10;
  }
  fVar14 = (pIVar3->NavScoringRectScreen).Min.y;
  fVar15 = (pIVar3->NavScoringRectScreen).Max.y;
  fVar16 = fVar15 - fVar14;
  fVar12 = (cand_local.Max.y - cand_local.Min.y) * 0.8 + cand_local.Min.y;
  fVar13 = fVar16 * 0.2 + fVar14;
  if (fVar13 <= fVar12) {
    fVar12 = (cand_local.Max.y - cand_local.Min.y) * 0.2 + cand_local.Min.y;
    fVar13 = fVar16 * 0.8 + fVar14;
    if (fVar13 < fVar12) {
      fVar12 = fVar12 - fVar13;
      goto LAB_0012337b;
    }
    fVar12 = 0.0;
    bVar4 = false;
  }
  else {
    fVar12 = fVar12 - fVar13;
LAB_0012337b:
    bVar4 = fVar12 != 0.0;
    if (((fVar11 != 0.0) || (NAN(fVar11))) && ((fVar12 != 0.0 || (NAN(fVar12))))) {
      fVar11 = fVar11 / 1000.0 + *(float *)(&DAT_00181b38 + (ulong)(0.0 < fVar11) * 4);
      bVar4 = true;
    }
  }
  fVar9 = (cand_local.Min.x + cand_local.Max.x) - (fVar10 + fVar9);
  fVar10 = (cand_local.Min.y + cand_local.Max.y) - (fVar14 + fVar15);
  fVar14 = ABS(fVar12) + ABS(fVar11);
  fVar15 = ABS(fVar9) + ABS(fVar10);
  if (bVar4) {
LAB_00123443:
    fVar13 = fVar14;
    uVar5 = (uint)(0.0 < fVar11);
    fVar10 = fVar12;
    fVar9 = fVar11;
    if (ABS(fVar11) <= ABS(fVar12)) {
      uVar5 = 0.0 < fVar12 | 2;
    }
  }
  else {
    if ((fVar11 != 0.0) || (NAN(fVar11))) goto LAB_00123443;
    if ((((fVar9 != 0.0) || (NAN(fVar9))) || (fVar10 != 0.0)) || (NAN(fVar10))) {
      fVar13 = fVar15;
      uVar5 = 0.0 < fVar10 | 2;
      if (ABS(fVar10) < ABS(fVar9)) {
        uVar5 = (uint)(0.0 < fVar9);
      }
    }
    else {
      fVar13 = 0.0;
      uVar5 = (uint)(pIVar3->NavId <= (pIVar2->DC).LastItemId);
      fVar10 = 0.0;
      fVar9 = 0.0;
    }
  }
  uVar1 = pIVar3->NavMoveDir;
  fVar16 = result->DistBox;
  if (uVar5 == uVar1) {
    if (fVar14 < fVar16) {
      result->DistBox = fVar14;
      result->DistCenter = fVar15;
      return true;
    }
    if ((fVar14 == fVar16) && (!NAN(fVar14) && !NAN(fVar16))) {
      fVar14 = result->DistCenter;
      if (fVar15 < fVar14) {
        result->DistCenter = fVar15;
LAB_001234e0:
        bVar4 = true;
        goto LAB_001234e6;
      }
      if ((fVar15 == fVar14) && (!NAN(fVar15) && !NAN(fVar14))) {
        if ((uVar5 & 2) == 0) {
          fVar12 = fVar11;
        }
        if (fVar12 < 0.0) goto LAB_001234e0;
      }
    }
  }
  bVar4 = false;
LAB_001234e6:
  if (fVar16 != 3.4028235e+38) {
    return bVar4;
  }
  if (NAN(fVar16)) {
    return bVar4;
  }
  if (result->DistAxial <= fVar13) {
    return bVar4;
  }
  if (pIVar3->NavLayer == ImGuiNavLayer_Menu) {
    if ((pIVar3->NavWindow->Flags & 0x10000000) != 0) {
      return bVar4;
    }
    if (((0.0 <= fVar9 || uVar1 != 0) && (fVar9 <= 0.0 || uVar1 != 1)) &&
       ((uVar1 != 2 || (0.0 <= fVar10)))) {
      if (uVar1 != 3) {
        return bVar4;
      }
      if (fVar10 <= 0.0) {
        return bVar4;
      }
    }
    result->DistAxial = fVar13;
    return true;
  }
  return bVar4;
}

Assistant:

static bool NavScoreItem(ImGuiNavMoveResult* result, ImRect cand)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.NavLayer != window->DC.NavLayerCurrent)
        return false;

    const ImRect& curr = g.NavScoringRectScreen; // Current modified source rect (NB: we've applied Max.x = Min.x in NavUpdate() to inhibit the effect of having varied item width)
    g.NavScoringCount++;

    // When entering through a NavFlattened border, we consider child window items as fully clipped for scoring
    if (window->ParentWindow == g.NavWindow)
    {
        IM_ASSERT((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened);
        if (!window->ClipRect.Contains(cand))
            return false;
        cand.ClipWithFull(window->ClipRect); // This allows the scored item to not overlap other candidates in the parent window
    }

    // We perform scoring on items bounding box clipped by the current clipping rectangle on the other axis (clipping on our movement axis would give us equal scores for all clipped items)
    // For example, this ensure that items in one column are not reached when moving vertically from items in another column.
    NavClampRectToVisibleAreaForMoveDir(g.NavMoveClipDir, cand, window->ClipRect);

    // Compute distance between boxes
    // FIXME-NAV: Introducing biases for vertical navigation, needs to be removed.
    float dbx = NavScoreItemDistInterval(cand.Min.x, cand.Max.x, curr.Min.x, curr.Max.x);
    float dby = NavScoreItemDistInterval(ImLerp(cand.Min.y, cand.Max.y, 0.2f), ImLerp(cand.Min.y, cand.Max.y, 0.8f), ImLerp(curr.Min.y, curr.Max.y, 0.2f), ImLerp(curr.Min.y, curr.Max.y, 0.8f)); // Scale down on Y to keep using box-distance for vertically touching items
    if (dby != 0.0f && dbx != 0.0f)
       dbx = (dbx/1000.0f) + ((dbx > 0.0f) ? +1.0f : -1.0f);
    float dist_box = ImFabs(dbx) + ImFabs(dby);

    // Compute distance between centers (this is off by a factor of 2, but we only compare center distances with each other so it doesn't matter)
    float dcx = (cand.Min.x + cand.Max.x) - (curr.Min.x + curr.Max.x);
    float dcy = (cand.Min.y + cand.Max.y) - (curr.Min.y + curr.Max.y);
    float dist_center = ImFabs(dcx) + ImFabs(dcy); // L1 metric (need this for our connectedness guarantee)

    // Determine which quadrant of 'curr' our candidate item 'cand' lies in based on distance
    ImGuiDir quadrant;
    float dax = 0.0f, day = 0.0f, dist_axial = 0.0f;
    if (dbx != 0.0f || dby != 0.0f)
    {
        // For non-overlapping boxes, use distance between boxes
        dax = dbx;
        day = dby;
        dist_axial = dist_box;
        quadrant = ImGetDirQuadrantFromDelta(dbx, dby);
    }
    else if (dcx != 0.0f || dcy != 0.0f)
    {
        // For overlapping boxes with different centers, use distance between centers
        dax = dcx;
        day = dcy;
        dist_axial = dist_center;
        quadrant = ImGetDirQuadrantFromDelta(dcx, dcy);
    }
    else
    {
        // Degenerate case: two overlapping buttons with same center, break ties arbitrarily (note that LastItemId here is really the _previous_ item order, but it doesn't matter)
        quadrant = (window->DC.LastItemId < g.NavId) ? ImGuiDir_Left : ImGuiDir_Right;
    }

#if IMGUI_DEBUG_NAV_SCORING
    char buf[128];
    if (ImGui::IsMouseHoveringRect(cand.Min, cand.Max))
    {
        ImFormatString(buf, IM_ARRAYSIZE(buf), "dbox (%.2f,%.2f->%.4f)\ndcen (%.2f,%.2f->%.4f)\nd (%.2f,%.2f->%.4f)\nnav %c, quadrant %c", dbx, dby, dist_box, dcx, dcy, dist_center, dax, day, dist_axial, "WENS"[g.NavMoveDir], "WENS"[quadrant]);
        ImDrawList* draw_list = ImGui::GetOverlayDrawList(window);
        draw_list->AddRect(curr.Min, curr.Max, IM_COL32(255,200,0,100));
        draw_list->AddRect(cand.Min, cand.Max, IM_COL32(255,255,0,200));
        draw_list->AddRectFilled(cand.Max-ImVec2(4,4), cand.Max+ImGui::CalcTextSize(buf)+ImVec2(4,4), IM_COL32(40,0,0,150));
        draw_list->AddText(g.IO.FontDefault, 13.0f, cand.Max, ~0U, buf);
    }
    else if (g.IO.KeyCtrl) // Hold to preview score in matching quadrant. Press C to rotate.
    {
        if (ImGui::IsKeyPressedMap(ImGuiKey_C)) { g.NavMoveDirLast = (ImGuiDir)((g.NavMoveDirLast + 1) & 3); g.IO.KeysDownDuration[g.IO.KeyMap[ImGuiKey_C]] = 0.01f; }
        if (quadrant == g.NavMoveDir)
        {
            ImFormatString(buf, IM_ARRAYSIZE(buf), "%.0f/%.0f", dist_box, dist_center);
            ImDrawList* draw_list = ImGui::GetOverlayDrawList(window);
            draw_list->AddRectFilled(cand.Min, cand.Max, IM_COL32(255, 0, 0, 200));
            draw_list->AddText(g.IO.FontDefault, 13.0f, cand.Min, IM_COL32(255, 255, 255, 255), buf);
        }
    }
 #endif

    // Is it in the quadrant we're interesting in moving to?
    bool new_best = false;
    if (quadrant == g.NavMoveDir)
    {
        // Does it beat the current best candidate?
        if (dist_box < result->DistBox)
        {
            result->DistBox = dist_box;
            result->DistCenter = dist_center;
            return true;
        }
        if (dist_box == result->DistBox)
        {
            // Try using distance between center points to break ties
            if (dist_center < result->DistCenter)
            {
                result->DistCenter = dist_center;
                new_best = true;
            }
            else if (dist_center == result->DistCenter)
            {
                // Still tied! we need to be extra-careful to make sure everything gets linked properly. We consistently break ties by symbolically moving "later" items
                // (with higher index) to the right/downwards by an infinitesimal amount since we the current "best" button already (so it must have a lower index),
                // this is fairly easy. This rule ensures that all buttons with dx==dy==0 will end up being linked in order of appearance along the x axis.
                if (((g.NavMoveDir == ImGuiDir_Up || g.NavMoveDir == ImGuiDir_Down) ? dby : dbx) < 0.0f) // moving bj to the right/down decreases distance
                    new_best = true;
            }
        }
    }

    // Axial check: if 'curr' has no link at all in some direction and 'cand' lies roughly in that direction, add a tentative link. This will only be kept if no "real" matches
    // are found, so it only augments the graph produced by the above method using extra links. (important, since it doesn't guarantee strong connectedness)
    // This is just to avoid buttons having no links in a particular direction when there's a suitable neighbor. you get good graphs without this too.
    // 2017/09/29: FIXME: This now currently only enabled inside menu bars, ideally we'd disable it everywhere. Menus in particular need to catch failure. For general navigation it feels awkward.
    // Disabling it may lead to disconnected graphs when nodes are very spaced out on different axis. Perhaps consider offering this as an option?
    if (result->DistBox == FLT_MAX && dist_axial < result->DistAxial)  // Check axial match
        if (g.NavLayer == 1 && !(g.NavWindow->Flags & ImGuiWindowFlags_ChildMenu))
            if ((g.NavMoveDir == ImGuiDir_Left && dax < 0.0f) || (g.NavMoveDir == ImGuiDir_Right && dax > 0.0f) || (g.NavMoveDir == ImGuiDir_Up && day < 0.0f) || (g.NavMoveDir == ImGuiDir_Down && day > 0.0f))
            {
                result->DistAxial = dist_axial;
                new_best = true;
            }

    return new_best;
}